

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Widget.cpp
# Opt level: O1

void __thiscall gui::Widget::Widget(Widget *this,String *name)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
  super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
  super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Widget_0027cc40;
  (this->onMouseEnter).enabled_ = true;
  p_Var1 = &(this->onMouseEnter).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onMouseEnter).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onMouseEnter).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onMouseEnter).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onMouseEnter).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onMouseEnter).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onMouseLeave).enabled_ = true;
  p_Var1 = &(this->onMouseLeave).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onMouseLeave).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onMouseLeave).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onMouseLeave).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onMouseLeave).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onMouseLeave).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onFocusGained).enabled_ = true;
  p_Var1 = &(this->onFocusGained).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onFocusGained).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onFocusGained).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onFocusGained).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onFocusGained).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onFocusGained).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->onFocusLost).enabled_ = true;
  p_Var1 = &(this->onFocusLost).callbacks_._M_t._M_impl.super__Rb_tree_header;
  (this->onFocusLost).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->onFocusLost).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->onFocusLost).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->onFocusLost).callbacks_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->onFocusLost).callbacks_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sf::Transformable::Transformable(&this->transformable_);
  sf::String::String(&this->name_,name);
  this->parent_ = (Container *)0x0;
  this->gui_ = (Gui *)0x0;
  this->visible_ = true;
  this->enabled_ = true;
  this->focused_ = false;
  this->focusable_ = true;
  this->mouseHover_ = false;
  return;
}

Assistant:

Widget::Widget(const sf::String& name) :
    name_(name),
    parent_(nullptr),
    gui_(nullptr),
    visible_(true),
    enabled_(true),
    focused_(false),
    focusable_(true),
    mouseHover_(false) {
}